

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffmcrd(fitsfile *fptr,char *keyname,char *card,int *status)

{
  int iVar1;
  size_t sVar2;
  int *in_RCX;
  bool bVar3;
  int len;
  int keypos;
  char nextcomm [73];
  char value [81];
  char comm [81];
  char valstring [81];
  char tcard [81];
  int local_200;
  int *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  char local_1a8 [24];
  int *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  fitsfile *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  fitsfile *in_stack_fffffffffffffeb8;
  int *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  fitsfile *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  fitsfile *in_stack_ffffffffffffff58;
  int local_4;
  
  if (*in_RCX < 1) {
    iVar1 = ffgcrd(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   in_stack_ffffffffffffff10);
    if (iVar1 < 1) {
      ffmkey(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      ffpsvc(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             &in_stack_fffffffffffffe80->HDUposition);
      if (*in_RCX < 1) {
        ffpmrk();
        ffc2s(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        if (*in_RCX == 0xcc) {
          ffcmrk();
          *in_RCX = 0;
        }
        else {
          sVar2 = strlen(local_1a8);
          local_200 = (int)sVar2;
          while( true ) {
            bVar3 = false;
            if (local_200 != 0) {
              bVar3 = local_1a8[local_200 + -1] == '&';
            }
            if (!bVar3) break;
            ffgcnt(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                   in_stack_fffffffffffffea0);
            if (local_1a8[0] == '\0') {
              local_200 = 0;
            }
            else {
              ffdrec(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
              sVar2 = strlen(local_1a8);
              local_200 = (int)sVar2;
            }
          }
        }
        local_4 = *in_RCX;
      }
      else {
        local_4 = *in_RCX;
      }
    }
    else {
      local_4 = *in_RCX;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffmcrd(fitsfile *fptr,      /* I - FITS file pointer  */
           const char *keyname, /* I - keyword name       */
           const char *card,    /* I - card string value  */
           int *status)         /* IO - error status      */
{
    char tcard[FLEN_CARD], valstring[FLEN_CARD], comm[FLEN_CARD], value[FLEN_CARD];
    char nextcomm[FLEN_COMMENT];
    int keypos, len;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgcrd(fptr, keyname, tcard, status) > 0)
        return(*status);

    ffmkey(fptr, card, status);

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80) + 1;

    ffpsvc(tcard, valstring, comm, status);

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        ffgcnt(fptr, value, nextcomm, status);
        if (*value)
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}